

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependInt16
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,int16 value,
          BufferBuilderInt16 **entryOut)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  BufferBuilder *pBVar2;
  ImmutableList<Js::BufferBuilder_*> *pIVar3;
  
  pBVar2 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,this->alloc,0x366bee);
  pBVar2->clue = clue;
  pBVar2->offset = 0xffffffff;
  pBVar2->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f2fe8;
  *(int16 *)&pBVar2->field_0x14 = value;
  pIVar1 = builder->list;
  pIVar3 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
  pIVar3->value = pBVar2;
  pIVar3->next = pIVar1;
  builder->list = pIVar3;
  if (entryOut != (BufferBuilderInt16 **)0x0) {
    *entryOut = (BufferBuilderInt16 *)pBVar2;
  }
  return 2;
}

Assistant:

uint32 PrependInt16(BufferBuilderList & builder, LPCWSTR clue, int16 value, BufferBuilderInt16 ** entryOut = nullptr)
    {
        auto entry = Anew(alloc, BufferBuilderInt16, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        if (entryOut)
        {
            *entryOut = entry;
        }
        return sizeof(int16);
    }